

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O2

void __thiscall QDBusListener::saveJson(QDBusListener *this,QString *fileName)

{
  QJsonValue *pQVar1;
  DBusKey *pDVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  QDebug *this_00;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QLatin1String local_b8;
  QJsonObject obj;
  QLatin1String local_98;
  QJsonDocument doc;
  Data local_80;
  QJsonObject root;
  QJsonArray sigs;
  undefined1 local_68 [16];
  QArrayDataPointer<char> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)local_68,(QString *)fileName);
  cVar3 = QFile::open((QFile *)local_68,2);
  if (cVar3 == '\0') {
    lcQpaThemeDBus();
    if (((byte)lcQpaThemeDBus::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
       ) {
      local_58.d._0_4_ = 2;
      local_58._4_8_ = 0;
      local_58._12_8_ = 0;
      local_58.size._4_4_ = 0;
      local_40 = lcQpaThemeDBus::category.name;
      QMessageLogger::warning();
      this_00 = QDebug::operator<<((QDebug *)&doc,fileName);
      QDebug::operator<<(this_00,"could not be opened for writing.");
      QDebug::~QDebug((QDebug *)&doc);
    }
  }
  else {
    _sigs = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray(&sigs);
    lVar5 = 0;
    pQVar1 = (QJsonValue *)(local_68 + 0x10);
    for (lVar6 = 0; lVar6 != (this->m_signalMap).c.keys.d.size; lVar6 = lVar6 + 1) {
      pDVar2 = (this->m_signalMap).c.keys.d.ptr;
      _root = &DAT_aaaaaaaaaaaaaaaa;
      QJsonObject::QJsonObject(&root);
      QJsonValue::QJsonValue(pQVar1,(QString *)((long)&(pDVar2->location).d.d + lVar5));
      _doc = (QMetaObject *)QJsonObject::operator[]((QLatin1String *)&root);
      QJsonValueRef::operator=((QJsonValueRef *)&doc,pQVar1);
      QJsonValue::~QJsonValue(pQVar1);
      QJsonValue::QJsonValue(pQVar1,(QString *)((long)&(pDVar2->key).d.d + lVar5));
      _doc = (QMetaEnum)QJsonObject::operator[]((QLatin1String *)&root);
      QJsonValueRef::operator=((QJsonValueRef *)&doc,pQVar1);
      QJsonValue::~QJsonValue(pQVar1);
      _doc = QMetaEnum::fromType<QDBusListener::Provider>();
      pcVar4 = (char *)QMetaEnum::valueToKey((ulonglong)&doc);
      QLatin1String::QLatin1String(&local_98,pcVar4);
      QJsonValue::QJsonValue(pQVar1,(QLatin1String *)local_98.m_size);
      _obj = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&root);
      QJsonValueRef::operator=((QJsonValueRef *)&obj,pQVar1);
      QJsonValue::~QJsonValue(pQVar1);
      _doc = QMetaEnum::fromType<QDBusListener::Setting>();
      pcVar4 = (char *)QMetaEnum::valueToKey((ulonglong)&doc);
      QLatin1String::QLatin1String(&local_b8,pcVar4);
      QJsonValue::QJsonValue(pQVar1,(QLatin1String *)local_b8.m_size);
      _obj = (undefined1 *)QJsonObject::operator[]((QLatin1String *)&root);
      QJsonValueRef::operator=((QJsonValueRef *)&obj,pQVar1);
      QJsonValue::~QJsonValue(pQVar1);
      QJsonValue::QJsonValue(pQVar1,&root);
      QJsonArray::append((QJsonValue *)&sigs);
      QJsonValue::~QJsonValue(pQVar1);
      QJsonObject::~QJsonObject(&root);
      lVar5 = lVar5 + 0x30;
    }
    _obj = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject(&obj);
    pQVar1 = (QJsonValue *)(local_68 + 0x10);
    QJsonValue::QJsonValue(pQVar1,&sigs);
    _doc = (QMetaObject *)QJsonObject::operator[]((QLatin1String *)&obj);
    QJsonValueRef::operator=((QJsonValueRef *)&doc,pQVar1);
    QJsonValue::~QJsonValue(pQVar1);
    _root = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject(&root);
    pQVar1 = (QJsonValue *)(local_68 + 0x10);
    QJsonValue::QJsonValue(pQVar1,&obj);
    auVar7 = QJsonObject::operator[]((QLatin1String *)&root);
    _doc = auVar7._0_8_;
    QJsonValueRef::operator=((QJsonValueRef *)&doc,pQVar1);
    QJsonValue::~QJsonValue(pQVar1);
    local_80.d = auVar7._8_8_;
    _doc = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::QJsonDocument(&doc,&root);
    QJsonDocument::toJson((QArrayDataPointer<char> *)(local_68 + 0x10),&doc,0);
    QIODevice::write((QByteArray *)local_68);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_68 + 0x10));
    QFileDevice::close();
    QJsonDocument::~QJsonDocument(&doc);
    QJsonObject::~QJsonObject(&root);
    QJsonObject::~QJsonObject(&obj);
    QJsonArray::~QJsonArray(&sigs);
  }
  QFile::~QFile((QFile *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusListener::saveJson(const QString &fileName) const
{
    Q_ASSERT(!m_signalMap.isEmpty());
    Q_ASSERT(!fileName.isEmpty());
    QFile file(fileName);
    if (!file.open(QIODevice::WriteOnly)) {
        qCWarning(lcQpaThemeDBus) << fileName << "could not be opened for writing.";
        return;
    }

    QJsonArray sigs;
    for (auto sig = m_signalMap.constBegin(); sig != m_signalMap.constEnd(); ++sig) {
        const DBusKey &dkey = sig.key();
        const ChangeSignal &csig = sig.value();
        QJsonObject obj;
        obj[JsonKeys::dbusLocation()] = dkey.location;
        obj[JsonKeys::dbusKey()] = dkey.key;
        obj[JsonKeys::provider()] = QLatin1StringView(QMetaEnum::fromType<Provider>()
                                            .valueToKey(static_cast<int>(csig.provider)));
        obj[JsonKeys::setting()] = QLatin1StringView(QMetaEnum::fromType<Setting>()
                                           .valueToKey(static_cast<int>(csig.setting)));
        sigs.append(obj);
    }
    QJsonObject obj;
    obj[JsonKeys::dbusSignals()] = sigs;
    QJsonObject root;
    root[JsonKeys::root()] = obj;
    QJsonDocument doc(root);
    file.write(doc.toJson());
    file.close();
}